

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::ComputeDefines_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  size_t headTarget;
  bool bVar1;
  string *psVar2;
  string local_270;
  cmValue local_250;
  cmValue config_compile_defs;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  undefined1 local_1c8 [8];
  string defPropName;
  cmValue local_188;
  cmValue compile_defs;
  undefined1 local_178 [8];
  string COMPILE_DEFINITIONS;
  string local_138;
  undefined1 local_118 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_a8;
  string *local_88;
  string *config;
  string *language;
  cmMakefile *local_68;
  cmMakefile *makefile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *lg_local;
  cmSourceFile *source_local;
  cmExtraSublimeTextGenerator *this_local;
  string *definesString;
  
  defines._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)target;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&makefile);
  local_68 = cmLocalGenerator::GetMakefile(lg);
  config = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  this_00 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"CMAKE_BUILD_TYPE",
             (allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(genexInterpreter.Language.field_2._M_local_buf + 0xf));
  local_88 = psVar2;
  std::__cxx11::string::string((string *)&local_138,(string *)psVar2);
  headTarget = defines._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string
            ((string *)(COMPILE_DEFINITIONS.field_2._M_local_buf + 8),(string *)config);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_118,lg,&local_138,
             (cmGeneratorTarget *)headTarget,(string *)((long)&COMPILE_DEFINITIONS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_DEFINITIONS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_138);
  cmLocalGenerator::GetTargetDefines
            (lg,(cmGeneratorTarget *)defines._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_88,config,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&makefile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_178,"COMPILE_DEFINITIONS",
             (allocator<char> *)((long)&compile_defs.Value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&compile_defs.Value + 7));
  local_188 = cmSourceFile::GetProperty(source,(string *)local_178);
  bVar1 = cmValue::operator_cast_to_bool(&local_188);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_188);
    std::__cxx11::string::string((string *)(defPropName.field_2._M_local_buf + 8),(string *)psVar2);
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_118,
                        (string *)((long)&defPropName.field_2 + 8),(string *)local_178);
    cmLocalGenerator::AppendDefines
              (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&makefile,psVar2);
    std::__cxx11::string::~string((string *)(defPropName.field_2._M_local_buf + 8));
  }
  cmAlphaNum::cmAlphaNum(&local_1f8,"COMPILE_DEFINITIONS_");
  cmsys::SystemTools::UpperCase((string *)&config_compile_defs,local_88);
  cmAlphaNum::cmAlphaNum(&local_228,(string *)&config_compile_defs);
  cmStrCat<>((string *)local_1c8,&local_1f8,&local_228);
  std::__cxx11::string::~string((string *)&config_compile_defs);
  local_250 = cmSourceFile::GetProperty(source,(string *)local_1c8);
  bVar1 = cmValue::operator_cast_to_bool(&local_250);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_250);
    std::__cxx11::string::string((string *)&local_270,(string *)psVar2);
    psVar2 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_118,&local_270,(string *)local_178
                       );
    cmLocalGenerator::AppendDefines
              (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&makefile,psVar2);
    std::__cxx11::string::~string((string *)&local_270);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cmLocalGenerator::JoinDefines
            (lg,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&makefile,__return_storage_ptr__,config);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_178);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_118);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&makefile);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeDefines(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::set<std::string> defines;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetOrDetermineLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add preprocessor definitions for this target and configuration.
  lg->GetTargetDefines(target, config, language, defines);
  const std::string COMPILE_DEFINITIONS("COMPILE_DEFINITIONS");
  if (cmValue compile_defs = source->GetProperty(COMPILE_DEFINITIONS)) {
    lg->AppendDefines(
      defines, genexInterpreter.Evaluate(*compile_defs, COMPILE_DEFINITIONS));
  }

  std::string defPropName =
    cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
  if (cmValue config_compile_defs = source->GetProperty(defPropName)) {
    lg->AppendDefines(
      defines,
      genexInterpreter.Evaluate(*config_compile_defs, COMPILE_DEFINITIONS));
  }

  std::string definesString;
  lg->JoinDefines(defines, definesString, language);

  return definesString;
}